

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ILS.h
# Opt level: O0

double __thiscall
imrt::ILS::beamTargetedSearch(ILS *this,Plan *current_plan,int max_time,int max_iterations)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  clock_t cVar4;
  Plan *this_00;
  ulong uVar5;
  int in_ECX;
  int in_EDX;
  Plan *in_RSI;
  long *in_RDI;
  float fVar6;
  double dVar7;
  double dVar8;
  int perturbation_iteration;
  int iteration;
  int no_improvement;
  bool flag;
  double used_time;
  double best_eval;
  double aux_eval;
  double local_eval;
  pair<bool,_std::pair<imrt::Station_*,_int>_> target_beam;
  Plan *best_plan;
  clock_t time_end;
  EvaluationFunction *in_stack_000004b0;
  type in_stack_fffffffffffffef8;
  Station *in_stack_ffffffffffffff00;
  undefined1 local_b0 [24];
  Plan *in_stack_ffffffffffffff68;
  Plan *in_stack_ffffffffffffff70;
  int local_7c;
  int local_78;
  double local_70;
  Plan *in_stack_ffffffffffffff98;
  Plan *in_stack_ffffffffffffffa0;
  double dVar9;
  double local_58;
  byte local_50;
  undefined7 uStack_4f;
  Station *local_48;
  int local_40;
  
  poVar3 = std::operator<<((ostream *)&std::cout,"## Staring ILS search.");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  cVar4 = clock();
  in_RDI[2] = cVar4;
  this_00 = (Plan *)operator_new(0xd0);
  Plan::Plan(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  std::pair<bool,_std::pair<imrt::Station_*,_int>_>::
  pair<bool,_std::pair<imrt::Station_*,_int>,_true>
            ((pair<bool,_std::pair<imrt::Station_*,_int>_> *)0x115f63);
  dVar7 = Plan::eval((Plan *)in_stack_ffffffffffffff00);
  local_70 = 0.0;
  bVar1 = true;
  local_7c = 1;
  local_78 = 0;
  local_58 = dVar7;
  while (bVar1) {
    (**(code **)(*in_RDI + 0x30))(&stack0xffffffffffffff68,in_RDI,in_RSI);
    std::pair<bool,_std::pair<imrt::Station_*,_int>_>::operator=
              ((pair<bool,_std::pair<imrt::Station_*,_int>_> *)in_stack_ffffffffffffff00,
               in_stack_fffffffffffffef8);
    while (local_40 < 0) {
      poVar3 = std::operator<<((ostream *)&std::cout,"NOTE: No beamlet available.");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      local_58 = (double)(**(code **)(*in_RDI + 0x40))(in_RDI,in_RSI);
      (**(code **)(*in_RDI + 0x30))(local_b0,in_RDI,in_RSI);
      std::pair<bool,_std::pair<imrt::Station_*,_int>_>::operator=
                ((pair<bool,_std::pair<imrt::Station_*,_int>_> *)in_stack_ffffffffffffff00,
                 in_stack_fffffffffffffef8);
      if (local_58 < dVar7) {
        dVar7 = local_58;
        Plan::newCopy(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      }
    }
    poVar3 = std::operator<<((ostream *)&std::cout,"Iteration: ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_7c);
    poVar3 = std::operator<<(poVar3,", eval: ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,EvaluationFunction::n_evaluations);
    poVar3 = std::operator<<(poVar3,", time: ");
    fVar6 = roundf((float)(local_70 * 1000.0));
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,fVar6 / 1000.0);
    poVar3 = std::operator<<(poVar3,", best: ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,dVar7);
    poVar3 = std::operator<<(poVar3,", current: ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_58);
    poVar3 = std::operator<<(poVar3,", beamlet: ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_40);
    poVar3 = std::operator<<(poVar3,", station: ");
    iVar2 = Station::getAngle(local_48);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
    poVar3 = std::operator<<(poVar3,", +-: ");
    std::ostream::operator<<(poVar3,(bool)(local_50 & 1));
    in_stack_fffffffffffffef8 = (type)CONCAT71(uStack_4f,local_50);
    in_stack_ffffffffffffff00 = local_48;
    dVar8 = (double)(**(code **)(*in_RDI + 0x10))(in_RDI,in_RSI);
    std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    dVar9 = dVar8;
    if (dVar8 < dVar7) {
      Plan::newCopy(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      dVar7 = dVar8;
    }
    if (local_58 <= dVar9) {
      if (((dVar9 == local_58) && (!NAN(dVar9) && !NAN(local_58))) ||
         (uVar5 = (**(code **)(*in_RDI + 0x28))(dVar9,local_58), (uVar5 & 1) == 0)) {
        (**(code **)(*in_RDI + 0x50))(in_RDI,in_RSI);
        local_78 = local_78 + 1;
      }
      else {
        local_78 = 0;
        local_58 = dVar9;
      }
    }
    else {
      local_78 = 0;
      local_58 = dVar9;
    }
    if ((int)in_RDI[4] == 1) {
      (**(code **)(*in_RDI + 0x58))();
    }
    local_7c = local_7c + 1;
    cVar4 = clock();
    local_70 = (double)(cVar4 - in_RDI[2]) / 1000000.0;
    if ((in_EDX != 0) && ((double)in_EDX <= local_70)) {
      bVar1 = false;
    }
    if ((in_ECX != 0) && (in_ECX <= local_7c)) {
      bVar1 = false;
    }
    uVar5 = (**(code **)(*in_RDI + 0x48))(in_RDI,local_78,local_7c);
    if ((uVar5 & 1) != 0) {
      local_58 = (double)(**(code **)(*in_RDI + 0x40))(in_RDI,in_RSI);
      local_78 = local_78 / 2;
    }
  }
  Plan::newCopy(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  dVar7 = Plan::getEvaluation(in_RSI);
  Plan::getEvaluationFunction(this_00);
  EvaluationFunction::generate_voxel_dose_functions(in_stack_000004b0);
  return dVar7;
}

Assistant:

double beamTargetedSearch (Plan& current_plan, int max_time, int max_iterations) {

    cout << "## Staring ILS search." << endl;

    //Start time
    std::clock_t time_end;
    time_begin=clock();

    //Best plan found so far
    Plan& best_plan= *new Plan(current_plan);

    pair<bool, pair<Station*, int>> target_beam;
    double local_eval, aux_eval,  best_eval=current_plan.eval();
    double used_time=0;
    // flag is used for the termination criterion
    bool flag = true;
    int no_improvement, iteration=1, perturbation_iteration=0;
    no_improvement = 0;

    local_eval=best_eval;
    
    while (flag) {
      // Get the targeted beamlet for local search
      target_beam = getLSBeamlet(current_plan);
      while (target_beam.second.second < 0) {
        // If there is no beamlet available perturbate
        // until we get one
        cout << "NOTE: No beamlet available." << endl;
        local_eval = perturbation(current_plan);
        perturbation_iteration = iteration;
        target_beam = getLSBeamlet(current_plan);
        if (local_eval < best_eval) {
          best_eval=local_eval;
          best_plan.newCopy(current_plan);
        }
      }

      cout << "Iteration: " << iteration << 
              ", eval: " << 
              EvaluationFunction::n_evaluations << 
              ", time: " << 
              (roundf(used_time * 1000) / 1000)  << 
              ", best: " << best_eval <<
              ", current: " << local_eval  << 
              ", beamlet: " << target_beam.second.second  <<
              ", station: " << target_beam.second.first->getAngle() << 
              ", +-: " << target_beam.first;

      // Apply local search on the targeted beamlet
      aux_eval = localSearch (target_beam, current_plan);
      cout << endl;

      // Check if there is a new global best solution 
      if (aux_eval < best_eval) {
        best_eval=aux_eval;
        best_plan.newCopy(current_plan);
      }

      // Acceptance criterion
      if (aux_eval < local_eval) {
        // Accept improving solution
        local_eval = aux_eval;
        no_improvement = 0;
      } else if (aux_eval!= local_eval && acceptanceCriterion(aux_eval, local_eval)) {
        // Accept non-improving solution
        local_eval = aux_eval;
        no_improvement = 0;
      } else {
        // Not accept solution
        undoLast(current_plan);
        no_improvement ++;
      }

      // Update SA temperature
      if (acceptance==ACCEPT_SA)
         updateTemperature();

      iteration++;

      // Termination criterion
      time_end=clock();
      used_time=double(time_end- time_begin) / CLOCKS_PER_SEC;
      if (max_time!=0 && used_time >= max_time) flag = false;
      if (max_iterations!=0 && iteration>=max_iterations) flag = false;

      // Check if we should perturbate
      if ( perturbate(no_improvement, iteration )) {
        local_eval = perturbation(current_plan);
        perturbation_iteration = iteration;
        no_improvement=no_improvement/2;
      }
    }

    current_plan.newCopy(best_plan);
    aux_eval=current_plan.getEvaluation();
    best_plan.getEvaluationFunction()->generate_voxel_dose_functions();
    return(aux_eval);
  }